

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_MockPlugin_shouldNotFailAgainWhenTestAlreadyFailed_Test::testBody
          (TEST_MockPlugin_shouldNotFailAgainWhenTestAlreadyFailed_Test *this)

{
  TestTestingFixture fixture;
  SimpleString local_50;
  TestTestingFixture local_40;
  
  TestTestingFixture::TestTestingFixture(&local_40);
  TestTestingFixture::installPlugin
            (&local_40,&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin);
  TestTestingFixture::setTestFunction(&local_40,failTwiceFunction_);
  TestTestingFixture::runAllTests(&local_40);
  SimpleString::SimpleString(&local_50,"1 failures, 1 tests, 1 ran, 2 checks,");
  TestTestingFixture::assertPrintContains(&local_40,&local_50);
  SimpleString::~SimpleString(&local_50);
  TestTestingFixture::~TestTestingFixture(&local_40);
  return;
}

Assistant:

TEST(MockPlugin, shouldNotFailAgainWhenTestAlreadyFailed)
{
    TestTestingFixture fixture;
    fixture.installPlugin(&plugin);
    fixture.setTestFunction(failTwiceFunction_);
    fixture.runAllTests();
    fixture.assertPrintContains("1 failures, 1 tests, 1 ran, 2 checks,");
}